

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

string * __thiscall
flow::BinaryInstr<(flow::BinaryOperator)7,(flow::LiteralType)2>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *__s;
  allocator<char> local_39;
  string local_38;
  void *local_18;
  BinaryInstr<(flow::BinaryOperator)7,_(flow::LiteralType)2> *this_local;
  
  local_18 = this;
  this_local = (BinaryInstr<(flow::BinaryOperator)7,_(flow::LiteralType)2> *)__return_storage_ptr__;
  __s = cstr(*(BinaryOperator *)((long)this + 0x68));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override { return formatOne(cstr(operator_)); }